

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O2

Float __thiscall pbrt::Vertex::PDF(Vertex *this,Integrator *integrator,Vertex *prev,Vertex *next)

{
  anon_union_248_3_83785cfc_for_Vertex_2 *this_00;
  VertexType VVar1;
  undefined1 auVar2 [16];
  Vector3f wiRender;
  Float FVar3;
  undefined1 in_ZMM0 [64];
  undefined1 auVar10 [56];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  Point3f PVar13;
  Vector3<float> VVar14;
  anon_class_16_2_f9f09593 func;
  Float pdf;
  float local_cc;
  Tuple3<pbrt::Vector3,_float> local_c8;
  Tuple3<pbrt::Vector3,_float> local_b8;
  undefined1 local_a8 [16];
  Float unused;
  RayDifferential local_88;
  
  auVar10 = in_ZMM0._8_56_;
  if (this->type == Light) {
    FVar3 = PdfLight(this,integrator,next);
    return FVar3;
  }
  PVar13 = Interaction::p(&(next->field_2).ei.super_Interaction);
  local_cc = PVar13.super_Tuple3<pbrt::Point3,_float>.z;
  auVar4._0_8_ = PVar13.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar4._8_56_ = auVar10;
  this_00 = &this->field_2;
  local_a8 = auVar4._0_16_;
  PVar13 = Interaction::p(&(this_00->ei).super_Interaction);
  auVar5._0_8_ = PVar13.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar5._8_56_ = auVar10;
  auVar2 = vsubps_avx(local_a8,auVar5._0_16_);
  local_c8._0_8_ = vmovlps_avx(auVar2);
  local_c8.z = local_cc - PVar13.super_Tuple3<pbrt::Point3,_float>.z;
  auVar11._0_4_ = auVar2._0_4_ * auVar2._0_4_;
  auVar11._4_4_ = auVar2._4_4_ * auVar2._4_4_;
  auVar11._8_4_ = auVar2._8_4_ * auVar2._8_4_;
  auVar11._12_4_ = auVar2._12_4_ * auVar2._12_4_;
  auVar11 = vmovshdup_avx(auVar11);
  auVar11 = vfmadd231ss_fma(auVar11,auVar2,auVar2);
  auVar10 = ZEXT856(0);
  auVar11 = vfmadd231ss_fma(auVar11,ZEXT416((uint)local_c8.z),ZEXT416((uint)local_c8.z));
  if ((auVar11._0_4_ == 0.0) && (!NAN(auVar11._0_4_))) {
    return 0.0;
  }
  VVar14 = Normalize<float>((Vector3<float> *)&local_c8);
  local_c8.z = VVar14.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar6._0_8_ = VVar14.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar6._8_56_ = auVar10;
  local_b8.x = 0.0;
  local_b8.y = 0.0;
  local_b8.z = 0.0;
  local_c8._0_8_ = vmovlps_avx(auVar6._0_16_);
  if (prev == (Vertex *)0x0) {
    if (this->type != Camera) {
      LogFatal<char_const(&)[27]>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cpu/integrators.cpp"
                 ,0x6e0,"Check failed: %s",(char (*) [27])"type == VertexType::Camera");
    }
  }
  else {
    PVar13 = Interaction::p(&(prev->field_2).ei.super_Interaction);
    local_cc = PVar13.super_Tuple3<pbrt::Point3,_float>.z;
    auVar7._0_8_ = PVar13.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar7._8_56_ = auVar10;
    local_a8 = auVar7._0_16_;
    PVar13 = Interaction::p(&(this_00->ei).super_Interaction);
    auVar8._0_8_ = PVar13.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar8._8_56_ = auVar10;
    auVar2 = vsubps_avx(local_a8,auVar8._0_16_);
    local_b8._0_8_ = vmovlps_avx(auVar2);
    local_b8.z = local_cc - PVar13.super_Tuple3<pbrt::Point3,_float>.z;
    auVar12._0_4_ = auVar2._0_4_ * auVar2._0_4_;
    auVar12._4_4_ = auVar2._4_4_ * auVar2._4_4_;
    auVar12._8_4_ = auVar2._8_4_ * auVar2._8_4_;
    auVar12._12_4_ = auVar2._12_4_ * auVar2._12_4_;
    auVar11 = vmovshdup_avx(auVar12);
    auVar11 = vfmadd231ss_fma(auVar11,auVar2,auVar2);
    auVar10 = ZEXT856(0);
    auVar11 = vfmadd231ss_fma(auVar11,ZEXT416((uint)local_b8.z),ZEXT416((uint)local_b8.z));
    if ((auVar11._0_4_ == 0.0) && (!NAN(auVar11._0_4_))) {
      return 0.0;
    }
    VVar14 = Normalize<float>((Vector3<float> *)&local_b8);
    local_b8.z = VVar14.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar9._0_8_ = VVar14.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar9._8_56_ = auVar10;
    local_b8._0_8_ = vmovlps_avx(auVar9._0_16_);
    VVar1 = this->type;
    pdf = 0.0;
    if (VVar1 == Medium) {
      func.wi = (Vector3f *)&local_c8;
      func.wo = (Vector3f *)&local_b8;
      pdf = TaggedPointer<pbrt::HGPhaseFunction>::
            Dispatch<pbrt::PhaseFunctionHandle::p(pbrt::Vector3<float>const&,pbrt::Vector3<float>const&)const::_lambda(auto:1)_1_>
                      (&(this->field_2).mi.phase.super_TaggedPointer<pbrt::HGPhaseFunction>,func);
      goto LAB_00403821;
    }
    if (VVar1 == Surface) {
      wiRender.super_Tuple3<pbrt::Vector3,_float>.z = local_c8.z;
      wiRender.super_Tuple3<pbrt::Vector3,_float>.x = local_c8.x;
      wiRender.super_Tuple3<pbrt::Vector3,_float>.y = local_c8.y;
      pdf = BSDF::PDF(&this->bsdf,(Vector3f)VVar14.super_Tuple3<pbrt::Vector3,_float>,wiRender,
                      Radiance,All);
      goto LAB_00403821;
    }
    if (VVar1 != Camera) {
      LogFatal(Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cpu/integrators.cpp"
               ,0x6eb,"Vertex::PDF(): Unimplemented");
    }
  }
  pdf = 0.0;
  Interaction::SpawnRay(&local_88,&(this_00->ei).super_Interaction,(Vector3f *)&local_c8);
  CameraHandle::PDF_We((CameraHandle *)&(this->field_2).mi.phase,&local_88.super_Ray,&unused,&pdf);
LAB_00403821:
  FVar3 = ConvertDensity(this,pdf,next);
  return FVar3;
}

Assistant:

Float PDF(const Integrator &integrator, const Vertex *prev,
              const Vertex &next) const {
        if (type == VertexType::Light)
            return PdfLight(integrator, next);
        // Compute directions to preceding and next vertex
        Vector3f wn = next.p() - p();
        if (LengthSquared(wn) == 0)
            return 0;
        wn = Normalize(wn);
        Vector3f wp;
        if (prev) {
            wp = prev->p() - p();
            if (LengthSquared(wp) == 0)
                return 0;
            wp = Normalize(wp);
        } else
            CHECK(type == VertexType::Camera);

        // Compute directional density depending on the vertex type
        Float pdf = 0, unused;
        if (type == VertexType::Camera)
            ei.camera.PDF_We(ei.SpawnRay(wn), &unused, &pdf);
        else if (type == VertexType::Surface)
            pdf = bsdf.PDF(wp, wn);
        else if (type == VertexType::Medium)
            pdf = mi.phase.p(wp, wn);
        else
            LOG_FATAL("Vertex::PDF(): Unimplemented");

        // Return probability per unit area at vertex _next_
        return ConvertDensity(pdf, next);
    }